

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

string * unicode_byte_to_utf8_abi_cxx11_(string *__return_storage_ptr__,uint8_t byte)

{
  int iVar1;
  mapped_type *pmVar2;
  iterator iVar3;
  int ch;
  uint32_t uVar4;
  int iVar5;
  key_type local_52;
  uint8_t byte_local;
  string local_50;
  
  byte_local = byte;
  if (unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_);
    if (iVar1 != 0) {
      unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_buckets =
           &unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_single_bucket;
      unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_bucket_count = 1;
      unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_element_count = 0;
      unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_rehash_policy.
      _M_max_load_factor = 1.0;
      unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_rehash_policy.
      _M_next_resize = 0;
      unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h._M_single_bucket =
           (__node_base_ptr)0x0;
      for (uVar4 = 0x21; uVar4 != 0x7f; uVar4 = uVar4 + 1) {
        unicode_cpt_to_utf8_abi_cxx11_(&local_50,uVar4);
        local_52 = (key_type)uVar4;
        pmVar2 = std::__detail::
                 _Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,
                              &local_52);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      for (uVar4 = 0xa1; uVar4 != 0xad; uVar4 = uVar4 + 1) {
        unicode_cpt_to_utf8_abi_cxx11_(&local_50,uVar4);
        local_52 = (key_type)uVar4;
        pmVar2 = std::__detail::
                 _Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,
                              &local_52);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      for (iVar1 = -0x52; iVar1 != 0; iVar1 = iVar1 + 1) {
        unicode_cpt_to_utf8_abi_cxx11_(&local_50,iVar1 + 0x100);
        local_52 = (key_type)iVar1;
        pmVar2 = std::__detail::
                 _Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,
                              &local_52);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      iVar5 = 0;
      for (iVar1 = 0; iVar1 != 0x100; iVar1 = iVar1 + 1) {
        local_50._M_dataplus._M_p._0_1_ = (key_type)iVar1;
        iVar3 = std::
                _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h,
                       (key_type_conflict3 *)&local_50);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          unicode_cpt_to_utf8_abi_cxx11_(&local_50,iVar5 + 0x100);
          local_52 = (key_type)iVar1;
          pmVar2 = std::__detail::
                   _Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,
                                &local_52);
          std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          iVar5 = iVar5 + 1;
        }
      }
      __cxa_atexit(std::
                   unordered_map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_);
    }
  }
  pmVar2 = std::__detail::
           _Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,&byte_local);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string unicode_byte_to_utf8(uint8_t byte) {
    static std::unordered_map<uint8_t, std::string> map = unicode_byte_to_utf8_map();
    return map.at(byte);
}